

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryStoreTestCase.cpp
# Opt level: O2

void __thiscall memoryStoreFixture::memoryStoreFixture(memoryStoreFixture *this,bool reset)

{
  MessageStore *pMVar1;
  SessionID sessionID;
  allocator<char> local_2f4;
  allocator<char> local_2f3;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  string local_2f0;
  STRING local_2d0;
  STRING local_2b0;
  STRING local_290;
  undefined1 local_270 [600];
  
  *(code **)this = FIX::SocketServer::accept;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"FIX.4.2",&local_2f1);
  FIX::BeginString::BeginString((BeginString *)local_270,&local_290);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"SETGET",&local_2f2);
  FIX::SenderCompID::SenderCompID((SenderCompID *)(local_270 + 0xb0),&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"TEST",&local_2f3);
  FIX::TargetCompID::TargetCompID((TargetCompID *)(local_270 + 0x58),&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"",&local_2f4);
  FIX::SessionID::SessionID
            ((SessionID *)(local_270 + 0x108),(string *)(local_270 + 0x10),
             (string *)(local_270 + 0xc0),(string *)(local_270 + 0x68),&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  FIX::FieldBase::~FieldBase((FieldBase *)(local_270 + 0x58));
  std::__cxx11::string::~string((string *)&local_2d0);
  FIX::FieldBase::~FieldBase((FieldBase *)(local_270 + 0xb0));
  std::__cxx11::string::~string((string *)&local_2b0);
  FIX::FieldBase::~FieldBase((FieldBase *)local_270);
  std::__cxx11::string::~string((string *)&local_290);
  FIX::UtcTimeStamp::now();
  pMVar1 = (MessageStore *)
           FIX::MemoryStoreFactory::create((UtcTimeStamp *)this,(SessionID *)local_270);
  this->object = pMVar1;
  if (reset) {
    FIX::UtcTimeStamp::now();
    (*pMVar1->_vptr_MessageStore[0xb])(pMVar1,local_270);
  }
  this->resetAfter = reset;
  FIX::SessionID::~SessionID((SessionID *)(local_270 + 0x108));
  return;
}

Assistant:

memoryStoreFixture(bool reset) {
    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("SETGET"), TargetCompID("TEST"));

    try {
      object = factory.create(UtcTimeStamp::now(), sessionID);
    } catch (std::exception &e) {
      std::cerr << e.what() << std::endl;
      throw;
    }

    if (reset) {
      object->reset(UtcTimeStamp::now());
    }

    this->resetAfter = reset;
  }